

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_lower.c
# Opt level: O0

void process_statement(CompilerState *compiler_state,AstNode *node)

{
  AstNode *pAVar1;
  undefined1 local_38 [8];
  PtrListIterator test_then_blockiter__;
  AstNode *test_then_block;
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  switch(node->type) {
  case AST_NONE:
    break;
  case STMT_RETURN:
    process_expression_list(compiler_state,(node->field_2).expression_stmt.var_expr_list);
    break;
  case STMT_GOTO:
  case STMT_LABEL:
    break;
  case STMT_DO:
    process_statement_list(compiler_state,(node->field_2).local_stmt.expr_list);
    break;
  case STMT_LOCAL:
    process_expression_list(compiler_state,(node->field_2).local_stmt.expr_list);
    break;
  case STMT_FUNCTION:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case STMT_IF:
    raviX_ptrlist_forward_iterator
              ((PtrListIterator *)local_38,(PtrList *)(node->field_2).local_stmt.var_list);
    test_then_blockiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
    while (test_then_blockiter__._16_8_ != 0) {
      process_expression(compiler_state,*(AstNode **)(test_then_blockiter__._16_8_ + 8));
      process_statement_list(compiler_state,*(AstNodeList **)(test_then_blockiter__._16_8_ + 0x18));
      test_then_blockiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_38);
    }
    if ((node->field_2).goto_stmt.name != (StringObject *)0x0) {
      process_statement_list
                (compiler_state,(node->field_2).test_then_block.test_then_statement_list);
    }
    break;
  default:
    fprintf(_stderr,"AST = %d\n",(ulong)node->type);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                  ,0x197,"void process_statement(CompilerState *, AstNode *)");
  case STMT_WHILE:
    process_expression(compiler_state,(node->field_2).function_stmt.name);
    process_statement_list(compiler_state,(node->field_2).test_then_block.test_then_statement_list);
    break;
  case STMT_FOR_IN:
    pAVar1 = lower_for_in_statement(compiler_state,node);
    if (pAVar1->type != STMT_DO) {
      __assert_fail("node->type == STMT_DO",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                    ,400,"void process_statement(CompilerState *, AstNode *)");
    }
    process_statement_list(compiler_state,(pAVar1->field_2).local_stmt.expr_list);
    break;
  case STMT_FOR_NUM:
    process_expression_list(compiler_state,(node->field_2).test_then_block.test_then_statement_list)
    ;
    process_statement_list(compiler_state,(node->field_2).for_stmt.for_statement_list);
    break;
  case STMT_REPEAT:
    process_statement_list(compiler_state,(node->field_2).test_then_block.test_then_statement_list);
    process_expression(compiler_state,(node->field_2).function_stmt.name);
    break;
  case STMT_EXPR:
    if ((node->field_2).local_stmt.var_list != (LuaSymbolList *)0x0) {
      process_expression_list(compiler_state,(node->field_2).expression_stmt.var_expr_list);
    }
    process_expression_list(compiler_state,(node->field_2).local_stmt.expr_list);
    break;
  case STMT_EMBEDDED_C:
  }
  return;
}

Assistant:

static void process_statement(CompilerState *compiler_state, AstNode *node)
{
	switch (node->type) {
	case AST_NONE:
		break;
	case STMT_RETURN:
		process_expression_list(compiler_state, node->return_stmt.expr_list);
		break;
	case STMT_LOCAL:
		process_expression_list(compiler_state, node->local_stmt.expr_list);
		break;
	case STMT_FUNCTION:
		process_expression(compiler_state, node->function_stmt.function_expr);
		break;
	case STMT_LABEL:
	case STMT_GOTO:
		break;
	case STMT_DO:
		process_statement_list(compiler_state, node->do_stmt.do_statement_list);
		break;
	case STMT_EXPR:
		if (node->expression_stmt.var_expr_list) {
			process_expression_list(compiler_state, node->expression_stmt.var_expr_list);
		}
		process_expression_list(compiler_state, node->expression_stmt.expr_list);
		break;
	case STMT_IF: {
		AstNode *test_then_block;
		FOR_EACH_PTR(node->if_stmt.if_condition_list, AstNode, test_then_block)
		{
			process_expression(compiler_state, test_then_block->test_then_block.condition);
			process_statement_list(compiler_state, test_then_block->test_then_block.test_then_statement_list);
		}
		END_FOR_EACH_PTR(node);
		if (node->if_stmt.else_block) {
			process_statement_list(compiler_state, node->if_stmt.else_statement_list);
		}
		break;
	}
	case STMT_WHILE:
		process_expression(compiler_state, node->while_or_repeat_stmt.condition);
		process_statement_list(compiler_state, node->while_or_repeat_stmt.loop_statement_list);
		break;
	case STMT_REPEAT:
		process_statement_list(compiler_state, node->while_or_repeat_stmt.loop_statement_list);
		process_expression(compiler_state, node->while_or_repeat_stmt.condition);
		break;
	case STMT_FOR_NUM:
		process_expression_list(compiler_state, node->for_stmt.expr_list);
		process_statement_list(compiler_state, node->for_stmt.for_statement_list);
		break;
	case STMT_FOR_IN:
		node = lower_for_in_statement(compiler_state, node);
		assert(node->type == STMT_DO);
		process_statement_list(compiler_state, node->do_stmt.do_statement_list);
		break;
	case STMT_EMBEDDED_C:
		break;
	default:
		fprintf(stderr, "AST = %d\n", node->type);
		assert(0);
		break;
	}
}